

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::buildMathChildIdMap
          (ValidatorImpl *this,XmlNodePtr *node,string *infoRef,IdMap *idMap)

{
  XmlAttribute *pXVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  XmlNode *pXVar7;
  XmlAttribute *pXVar8;
  ValidatorImpl *this_02;
  XmlNodePtr childNode;
  XmlAttributePtr attribute;
  string info;
  undefined1 local_158 [32];
  XmlNodePtr local_138;
  XmlAttribute local_128 [2];
  XmlNodePtr *local_118;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  XmlNode local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c8;
  XmlNode local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  XmlNode local_b0;
  long lStack_a8;
  string *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  ValidatorImpl *local_58;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_118 = node;
  local_a0 = infoRef;
  local_58 = this;
  XmlNode::firstAttribute(&local_d0);
  if ((XmlAttribute *)local_d0.mPimpl != (XmlAttribute *)0x0) {
    pXVar1 = (XmlAttribute *)(local_158 + 0x10);
    do {
      bVar3 = XmlAttribute::isType((XmlAttribute *)local_d0.mPimpl,"id","");
      if (bVar3) {
        local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_128;
        local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128[0].mPimpl._0_1_ = 0;
        XmlNode::name_abi_cxx11_
                  ((string *)local_158,
                   (local_118->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
        iVar4 = std::__cxx11::string::compare(local_158);
        if ((XmlAttribute *)local_158._0_8_ != pXVar1) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if (iVar4 == 0) {
          XmlNode::firstChild((XmlNode *)local_158);
          uVar2 = local_158._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if ((XmlAttribute *)uVar2 != (XmlAttribute *)0x0) {
            XmlNode::firstChild(&local_c0);
            XmlNode::convertToString_abi_cxx11_(&local_110,(XmlNode *)local_c0.mPimpl);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2b605c)
            ;
            plVar6 = plVar5 + 2;
            if ((long *)*plVar5 == plVar6) {
              local_e0 = *plVar6;
              lStack_d8 = plVar5[3];
              local_f0 = &local_e0;
            }
            else {
              local_e0 = *plVar6;
              local_f0 = (long *)*plVar5;
            }
            local_e8 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
            pXVar8 = (XmlAttribute *)(plVar5 + 2);
            if ((XmlAttribute *)*plVar5 == pXVar8) {
              local_158._16_8_ = pXVar8->mPimpl;
              local_158._24_8_ = plVar5[3];
              local_158._0_8_ = pXVar1;
            }
            else {
              local_158._16_8_ = pXVar8->mPimpl;
              local_158._0_8_ = (XmlAttribute *)*plVar5;
            }
            local_158._8_8_ = plVar5[1];
            *plVar5 = (long)pXVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_138,(string *)local_158);
            if ((XmlAttribute *)local_158._0_8_ != pXVar1) {
              operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,local_e0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              (ulong)(local_110.field_2._M_allocated_capacity + 1));
            }
            if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
            }
          }
        }
        XmlNode::name_abi_cxx11_
                  (&local_50,
                   (local_118->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2b755a);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_88 = *plVar6;
          lStack_80 = plVar5[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar6;
          local_98 = (long *)*plVar5;
        }
        local_90 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_c0.mPimpl = (XmlNodeImpl *)&local_b0;
        pXVar7 = (XmlNode *)(plVar5 + 2);
        if ((XmlNode *)*plVar5 == pXVar7) {
          local_b0.mPimpl = pXVar7->mPimpl;
          lStack_a8 = plVar5[3];
        }
        else {
          local_b0.mPimpl = pXVar7->mPimpl;
          local_c0.mPimpl = (XmlNodeImpl *)*plVar5;
        }
        local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        *plVar5 = (long)pXVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c0,
                                    (ulong)local_138.
                                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        plVar6 = plVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar6) {
          local_110.field_2._M_allocated_capacity = *plVar6;
          local_110.field_2._8_8_ = plVar5[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *plVar6;
          local_110._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_110._M_string_length = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar5[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar5;
        }
        local_e8 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f0,(ulong)(local_a0->_M_dataplus)._M_p);
        pXVar8 = (XmlAttribute *)(plVar5 + 2);
        if ((XmlAttribute *)*plVar5 == pXVar8) {
          local_158._16_8_ = pXVar8->mPimpl;
          local_158._24_8_ = plVar5[3];
          local_158._0_8_ = pXVar1;
        }
        else {
          local_158._16_8_ = pXVar8->mPimpl;
          local_158._0_8_ = (XmlAttribute *)*plVar5;
        }
        local_158._8_8_ = plVar5[1];
        *plVar5 = (long)pXVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_78,(string *)local_158);
        if ((XmlAttribute *)local_158._0_8_ != pXVar1) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        if ((XmlNode *)local_c0.mPimpl != &local_b0) {
          operator_delete(local_c0.mPimpl,(ulong)((long)&(local_b0.mPimpl)->mXmlNodePtr + 1));
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        this_02 = (ValidatorImpl *)local_158;
        XmlAttribute::value_abi_cxx11_((string *)local_158,(XmlAttribute *)local_d0.mPimpl);
        addIdMapItem(this_02,(string *)local_158,&local_78,idMap);
        if ((XmlAttribute *)local_158._0_8_ != pXVar1) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if ((XmlAttribute *)
            local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            local_128) {
          operator_delete(local_138.
                          super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          CONCAT71(local_128[0].mPimpl._1_7_,local_128[0].mPimpl._0_1_) + 1);
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_138);
      this_01 = p_Stack_c8;
      p_Stack_c8 = local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      local_d0.mPimpl =
           (XmlNodeImpl *)
           local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while ((XmlAttribute *)local_d0.mPimpl != (XmlAttribute *)0x0);
  }
  XmlNode::firstChild((XmlNode *)&local_138);
  if ((XmlAttribute *)
      local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (XmlAttribute *)0x0) {
    do {
      buildMathChildIdMap(local_58,&local_138,local_a0,idMap);
      XmlNode::next((XmlNode *)local_158);
      this_00._M_pi =
           local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._0_8_;
      local_158._0_8_ = (XmlAttribute *)0x0;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
    } while ((XmlAttribute *)
             local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (XmlAttribute *)0x0);
  }
  if (local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::buildMathChildIdMap(const XmlNodePtr &node, const std::string &infoRef, IdMap &idMap)
{
    std::string info;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("id")) {
            std::string variable;
            if (node->name() == "ci") {
                if (node->firstChild() != nullptr) {
                    variable = "'" + node->firstChild()->convertToString() + "' ";
                }
            }
            info = " - MathML " + node->name() + " element " + variable + "in " + infoRef;
            addIdMapItem(attribute->value(), info, idMap);
        }
        attribute = attribute->next();
    }
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        buildMathChildIdMap(childNode, infoRef, idMap);
        childNode = childNode->next();
    }
}